

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>::
visitStructSet(StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner> *this,
              StructSet *curr)

{
  Index index;
  Expression *expr;
  unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
  *this_00;
  bool bVar1;
  mapped_type *this_01;
  HeapType type_00;
  StructValues<wasm::LUBFinder> *this_02;
  LUBFinder *info;
  bool local_41;
  Function *local_38;
  HeapType local_30;
  BasicType local_24;
  Type local_20;
  Type type;
  StructSet *curr_local;
  StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner> *this_local;
  
  local_20.id = (curr->ref->type).id;
  local_24 = unreachable;
  type.id = (uintptr_t)curr;
  bVar1 = wasm::Type::operator==(&local_20,&local_24);
  local_41 = true;
  if (!bVar1) {
    local_41 = wasm::Type::isNull(&local_20);
  }
  if (local_41 == false) {
    expr = *(Expression **)(type.id + 0x20);
    local_30 = wasm::Type::getHeapType(&local_20);
    index = *(Index *)(type.id + 0x10);
    this_00 = &this->functionSetGetInfos->
               super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ;
    local_38 = Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
               ::getFunction(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                              ).
                              super_PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                              .
                              super_Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                            );
    this_01 = std::
              unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
              ::operator[](this_00,&local_38);
    type_00 = wasm::Type::getHeapType(&local_20);
    this_02 = StructValuesMap<wasm::LUBFinder>::operator[](this_01,type_00);
    info = StructValues<wasm::LUBFinder>::operator[](this_02,(ulong)*(uint *)(type.id + 0x10));
    noteExpressionOrCopy(this,expr,local_30,index,info);
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
    auto type = curr->ref->type;
    if (type == Type::unreachable || type.isNull()) {
      return;
    }

    // Note a write to this field of the struct.
    noteExpressionOrCopy(curr->value,
                         type.getHeapType(),
                         curr->index,
                         functionSetGetInfos[this->getFunction()]
                                            [type.getHeapType()][curr->index]);
  }